

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-engine.cpp
# Opt level: O3

void __thiscall
gepard::GepardEngine::setTransform
          (GepardEngine *this,Float a,Float b,Float c,Float d,Float e,Float f)

{
  pointer pGVar1;
  PathData *this_00;
  Transform local_40;
  
  Transform::Transform(&local_40,a,b,c,d,e,f);
  pGVar1 = (this->_context).states.
           super__Vector_base<gepard::GepardState,_std::allocator<gepard::GepardState>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pGVar1[-1].transform.data[4] = local_40.data[4];
  pGVar1[-1].transform.data[5] = local_40.data[5];
  pGVar1[-1].transform.data[2] = local_40.data[2];
  pGVar1[-1].transform.data[3] = local_40.data[3];
  pGVar1[-1].transform.data[0] = local_40.data[0];
  pGVar1[-1].transform.data[1] = local_40.data[1];
  this_00 = (this->_context).path._pathData;
  Transform::inverse(&local_40,
                     &(this->_context).states.
                      super__Vector_base<gepard::GepardState,_std::allocator<gepard::GepardState>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].transform);
  PathData::applyTransform(this_00,&local_40);
  return;
}

Assistant:

void GepardEngine::setTransform(Float a, Float b, Float c, Float d, Float e, Float f)
{
    state().transform = Transform(a, b, c, d, e, f);
    _context.path.pathData()->applyTransform(state().transform.inverse());
}